

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

TiXmlHandle __thiscall despot::util::tinyxml::TiXmlHandle::FirstChild(TiXmlHandle *this,char *value)

{
  TiXmlNode *pTVar1;
  char *in_RDX;
  
  if (*(TiXmlNode **)value != (TiXmlNode *)0x0) {
    pTVar1 = TiXmlNode::FirstChild(*(TiXmlNode **)value,in_RDX);
    if (pTVar1 != (TiXmlNode *)0x0) goto LAB_00178e1d;
  }
  pTVar1 = (TiXmlNode *)0x0;
LAB_00178e1d:
  this->node = pTVar1;
  return (TiXmlHandle)(TiXmlNode *)this;
}

Assistant:

TiXmlHandle TiXmlHandle::FirstChild(const char * value) const {
	if (node) {
		TiXmlNode* child = node->FirstChild(value);
		if (child)
			return TiXmlHandle(child);
	}
	return TiXmlHandle(0);
}